

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv_tcp_keepalive(uv_tcp_t *handle,int on,uint delay)

{
  int iVar1;
  
  iVar1 = (handle->io_watcher).fd;
  if ((iVar1 != -1) && (iVar1 = uv__tcp_keepalive(iVar1,on,delay), iVar1 != 0)) {
    return iVar1;
  }
  handle->flags = (uint)(on != 0) << 0xb | handle->flags & 0xfffff7ff;
  return 0;
}

Assistant:

int uv_tcp_keepalive(uv_tcp_t* handle, int on, unsigned int delay) {
  int err;

  if (uv__stream_fd(handle) != -1) {
    err =uv__tcp_keepalive(uv__stream_fd(handle), on, delay);
    if (err)
      return err;
  }

  if (on)
    handle->flags |= UV_TCP_KEEPALIVE;
  else
    handle->flags &= ~UV_TCP_KEEPALIVE;

  /* TODO Store delay if uv__stream_fd(handle) == -1 but don't want to enlarge
   *      uv_tcp_t with an int that's almost never used...
   */

  return 0;
}